

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxFacts.cpp
# Opt level: O2

SyntaxKind slang::syntax::SyntaxFacts::getKeywordType(TokenKind kind)

{
  undefined2 in_register_0000003a;
  int iVar1;
  
  iVar1 = CONCAT22(in_register_0000003a,kind);
  if (iVar1 == 0x78) {
    return CHandleType;
  }
  if (iVar1 == 0xa3) {
    return EventType;
  }
  if (iVar1 == 0x147) {
    return VoidType;
  }
  if (iVar1 != 0x100) {
    if (iVar1 == 0x115) {
      return ShortRealType;
    }
    if (iVar1 != 0x11e) {
      if (iVar1 == 0xff) {
        return RealType;
      }
      return Unknown;
    }
    return StringType;
  }
  return RealTimeType;
}

Assistant:

SyntaxKind SyntaxFacts::getKeywordType(TokenKind kind) {
    switch (kind) {
        case TokenKind::ShortRealKeyword: return SyntaxKind::ShortRealType;
        case TokenKind::RealKeyword: return SyntaxKind::RealType;
        case TokenKind::RealTimeKeyword: return SyntaxKind::RealTimeType;
        case TokenKind::StringKeyword: return SyntaxKind::StringType;
        case TokenKind::CHandleKeyword: return SyntaxKind::CHandleType;
        case TokenKind::EventKeyword: return SyntaxKind::EventType;
        case TokenKind::VoidKeyword: return SyntaxKind::VoidType;
        default: return SyntaxKind::Unknown;
    }
}